

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_flats.cpp
# Opt level: O0

void __thiscall GLFlat::DrawSkyboxSector(GLFlat *this,int pass,bool processlights)

{
  line_t *plVar1;
  int32_t iVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  undefined1 local_58 [8];
  FQuadDrawer qd;
  int rot;
  float z;
  float y;
  float x;
  line_t *ln;
  float local_28;
  int i;
  float maxy;
  float maxx;
  float miny;
  float minx;
  bool processlights_local;
  int pass_local;
  GLFlat *this_local;
  
  maxx = 3.4028235e+38;
  maxy = 3.4028235e+38;
  i = -0x800001;
  local_28 = -3.4028235e+38;
  for (ln._4_4_ = 0; ln._4_4_ < this->sector->linecount; ln._4_4_ = ln._4_4_ + 1) {
    plVar1 = this->sector->lines[ln._4_4_];
    dVar5 = vertex_t::fX(plVar1->v1);
    fVar3 = (float)dVar5;
    dVar5 = vertex_t::fY(plVar1->v1);
    fVar4 = (float)dVar5;
    if (fVar3 < maxx) {
      maxx = fVar3;
    }
    if (fVar4 < maxy) {
      maxy = fVar4;
    }
    if ((float)i < fVar3) {
      i = (int)fVar3;
    }
    if (local_28 < fVar4) {
      local_28 = fVar4;
    }
    dVar5 = vertex_t::fX(plVar1->v2);
    fVar3 = (float)dVar5;
    dVar5 = vertex_t::fY(plVar1->v2);
    fVar4 = (float)dVar5;
    if (fVar3 < maxx) {
      maxx = fVar3;
    }
    if (fVar4 < maxy) {
      maxy = fVar4;
    }
    if ((float)i < fVar3) {
      i = (int)fVar3;
    }
    if (local_28 < fVar4) {
      local_28 = fVar4;
    }
  }
  dVar5 = secplane_t::ZatPoint(&(this->plane).plane,0.0,0.0);
  qd._12_4_ = (BADTYPE)(dVar5 + (double)this->dz);
  iVar2 = xs_FloorToInt((real64)(double)((this->plane).Angle / 90.0),0.499999985);
  qd.ndx = -iVar2;
  FQuadDrawer::FQuadDrawer((FQuadDrawer *)local_58);
  FQuadDrawer::Set((FQuadDrawer *)local_58,0,maxx,(float)qd._12_4_,maxy,
                   DrawSkyboxSector::uvals[(int)(qd.ndx & 3)],
                   DrawSkyboxSector::vvals[(int)(qd.ndx & 3)]);
  FQuadDrawer::Set((FQuadDrawer *)local_58,1,maxx,(float)qd._12_4_,local_28,
                   DrawSkyboxSector::uvals[(int)(qd.ndx + 1U & 3)],
                   DrawSkyboxSector::vvals[(int)(qd.ndx + 1U & 3)]);
  FQuadDrawer::Set((FQuadDrawer *)local_58,2,(float)i,(float)qd._12_4_,local_28,
                   DrawSkyboxSector::uvals[(int)(qd.ndx + 2U & 3)],
                   DrawSkyboxSector::vvals[(int)(qd.ndx + 2U & 3)]);
  FQuadDrawer::Set((FQuadDrawer *)local_58,3,(float)i,(float)qd._12_4_,maxy,
                   DrawSkyboxSector::uvals[(int)(qd.ndx + 3U & 3)],
                   DrawSkyboxSector::vvals[(int)(qd.ndx + 3U & 3)]);
  FQuadDrawer::Render((FQuadDrawer *)local_58,6);
  flatvertices = flatvertices + 4;
  flatprimitives = flatprimitives + 1;
  return;
}

Assistant:

void GLFlat::DrawSkyboxSector(int pass, bool processlights)
{

	float minx = FLT_MAX, miny = FLT_MAX;
	float maxx = -FLT_MAX, maxy = -FLT_MAX;

	for (int i = 0; i < sector->linecount; i++)
	{
		line_t *ln = sector->lines[i];
		float x = ln->v1->fX();
		float y = ln->v1->fY();
		if (x < minx) minx = x;
		if (y < miny) miny = y;
		if (x > maxx) maxx = x;
		if (y > maxy) maxy = y;
		x = ln->v2->fX();
		y = ln->v2->fY();
		if (x < minx) minx = x;
		if (y < miny) miny = y;
		if (x > maxx) maxx = x;
		if (y > maxy) maxy = y;
	}

	float z = plane.plane.ZatPoint(0., 0.) + dz;
	static float uvals[] = { 0, 0, 1, 1 };
	static float vvals[] = { 1, 0, 0, 1 };
	int rot = -xs_FloorToInt(plane.Angle / 90.f);

	FQuadDrawer qd;

	qd.Set(0, minx, z, miny, uvals[rot & 3], vvals[rot & 3]);
	qd.Set(1, minx, z, maxy, uvals[(rot + 1) & 3], vvals[(rot + 1) & 3]);
	qd.Set(2, maxx, z, maxy, uvals[(rot + 2) & 3], vvals[(rot + 2) & 3]);
	qd.Set(3, maxx, z, miny, uvals[(rot + 3) & 3], vvals[(rot + 3) & 3]);
	qd.Render(GL_TRIANGLE_FAN);

	flatvertices += 4;
	flatprimitives++;
}